

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Matchers::Impl::Generic::
AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::toString
          (string *__return_storage_ptr__,
          AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  string *psVar1;
  pointer pPVar2;
  ulong uVar3;
  long lVar4;
  ostringstream local_1d0 [8];
  ostringstream oss;
  ios_base local_160 [264];
  string *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"( ",2);
  pPVar2 = (this->m_matchers).
           super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = __return_storage_ptr__;
  if ((this->m_matchers).
      super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0," and ",5);
        pPVar2 = (pointer)((long)&((this->m_matchers).
                                   super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar4);
      }
      (*(pPVar2->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
        _vptr_NonCopyable[6])(&local_50);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d0,(char *)local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      uVar3 = uVar3 + 1;
      pPVar2 = (this->m_matchers).
               super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 8;
    } while (uVar3 < (ulong)((long)(this->m_matchers).
                                   super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0," )",2);
  psVar1 = local_58;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1d0);
  std::ios_base::~ios_base(local_160);
  return psVar1;
}

Assistant:

virtual std::string toString() const {
                std::ostringstream oss;
                oss << "( ";
                for( std::size_t i = 0; i < m_matchers.size(); ++i ) {
                    if( i != 0 )
                        oss << " and ";
                    oss << m_matchers[i]->toString();
                }
                oss << " )";
                return oss.str();
            }